

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_half(secp256k1_fe *r)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  secp256k1_modinv64_modinfo *psVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  secp256k1_ge *a;
  long lVar9;
  ulong uVar10;
  secp256k1_ge *psVar11;
  secp256k1_ge *psVar12;
  secp256k1_ge *a_00;
  uint64_t *puVar13;
  ulong uVar14;
  uint64_t *puVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  secp256k1_ge *a_01;
  secp256k1_modinv64_modinfo *unaff_R15;
  secp256k1_modinv64_modinfo *psVar20;
  secp256k1_modinv64_modinfo *psVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  secp256k1_strauss_state sStack_b28;
  secp256k1_gej sStack_b10;
  secp256k1_fe asStack_a78 [8];
  secp256k1_ge asStack_8f8 [8];
  secp256k1_strauss_point_state sStack_5b8;
  ulong uStack_1a8;
  secp256k1_ge *psStack_1a0;
  secp256k1_modinv64_modinfo *psStack_198;
  secp256k1_ge *psStack_188;
  secp256k1_modinv64_modinfo *psStack_180;
  ulong uStack_178;
  secp256k1_ge *psStack_170;
  ulong uStack_168;
  ulong uStack_160;
  ulong uStack_158;
  secp256k1_modinv64_modinfo *psStack_150;
  ulong uStack_148;
  secp256k1_modinv64_modinfo *psStack_140;
  ulong uStack_138;
  undefined1 auStack_130 [48];
  secp256k1_modinv64_modinfo *psStack_100;
  ulong uStack_f8;
  ulong uStack_f0;
  secp256k1_ge *psStack_e8;
  undefined1 auStack_e0 [56];
  ulong uStack_a8;
  ulong uStack_a0;
  secp256k1_ge *psStack_98;
  secp256k1_modinv64_signed62 sStack_90;
  secp256k1_modinv64_signed62 sStack_60;
  secp256k1_fe *psStack_38;
  
  secp256k1_fe_verify(r);
  a = (secp256k1_ge *)r;
  secp256k1_fe_verify_magnitude(r,0x1f);
  psVar4 = (secp256k1_modinv64_modinfo *)r->n[0];
  uVar2 = -(ulong)((uint)psVar4 & 1);
  uVar5 = uVar2 >> 0xc;
  uVar10 = (long)(psVar4->modulus).v + (uVar5 & 0xffffefffffc2f);
  if ((uVar10 & 1) == 0) {
    uVar3 = (uVar2 >> 0x10) + r->n[4];
    uVar6 = uVar5 + r->n[3];
    uVar18 = (uint)(uVar2 >> 0x2c);
    auVar23._0_8_ = CONCAT44(uVar18,(int)uVar5);
    auVar23._8_4_ = (int)uVar5;
    auVar23._12_4_ = uVar18;
    uVar2 = auVar23._0_8_ + r->n[1];
    uVar5 = auVar23._8_8_ + r->n[2];
    r->n[0] = ((ulong)((uint)uVar2 & 1) << 0x33) + (uVar10 >> 1);
    r->n[1] = ((uVar5 & 1) << 0x33) + (uVar2 >> 1);
    r->n[2] = ((uVar6 & 1) << 0x33) + (uVar5 >> 1);
    r->n[3] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar6 >> 1);
    r->n[4] = uVar3 >> 1;
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_half_cold_1();
  uVar3 = 0;
  sStack_90.v[2] = 0;
  sStack_90.v[3] = 0;
  sStack_90.v[0] = 0;
  sStack_90.v[1] = 0;
  sStack_90.v[4] = 0;
  sStack_60.v[3] = 0;
  sStack_60.v[4] = 0;
  sStack_60.v[1] = 0;
  sStack_60.v[2] = 0;
  sStack_60.v[0] = 1;
  uStack_178 = (psVar4->modulus).v[4];
  auStack_130._0_8_ = (psVar4->modulus).v[0];
  uStack_148 = (psVar4->modulus).v[1];
  uStack_160 = (psVar4->modulus).v[2];
  uVar2 = (psVar4->modulus).v[3];
  auStack_e0._0_8_ = (a->x).n[0];
  psStack_140 = (secp256k1_modinv64_modinfo *)(a->x).n[1];
  psStack_150 = (secp256k1_modinv64_modinfo *)(a->x).n[2];
  uStack_168 = (a->x).n[3];
  auStack_e0._32_8_ = (a->x).n[4];
  uVar10 = 0xffffffffffffffff;
  psVar20 = (secp256k1_modinv64_modinfo *)auStack_e0._0_8_;
  uVar5 = auStack_130._0_8_;
  psStack_180 = psVar4;
  psStack_170 = (secp256k1_ge *)auStack_e0._32_8_;
  auStack_130._8_8_ = uStack_148;
  auStack_130._16_8_ = uStack_160;
  auStack_130._24_8_ = uVar2;
  auStack_130._32_8_ = uStack_178;
  auStack_130._40_8_ = a;
  auStack_e0._8_8_ = psStack_140;
  auStack_e0._16_8_ = psStack_150;
  auStack_e0._24_8_ = uStack_168;
  psStack_38 = r;
  do {
    a_01 = (secp256k1_ge *)0x8;
    lVar7 = 3;
    uVar6 = 0;
    uVar19 = 0;
    psVar11 = (secp256k1_ge *)0x8;
    psStack_188 = (secp256k1_ge *)0x8;
    psVar4 = psVar20;
    uVar8 = uVar5;
    psVar12 = a;
    psVar21 = unaff_R15;
    do {
      uStack_138 = uVar2;
      if ((uVar8 & 1) == 0) {
        psStack_198 = (secp256k1_modinv64_modinfo *)0x14c974;
        secp256k1_modinv64_cold_29();
LAB_0014c974:
        psStack_198 = (secp256k1_modinv64_modinfo *)0x14c979;
        secp256k1_modinv64_cold_1();
LAB_0014c979:
        psStack_198 = (secp256k1_modinv64_modinfo *)0x14c97e;
        secp256k1_modinv64_cold_2();
LAB_0014c97e:
        psStack_198 = (secp256k1_modinv64_modinfo *)0x14c983;
        secp256k1_modinv64_cold_28();
        goto LAB_0014c983;
      }
      psVar12 = (secp256k1_ge *)(uVar6 * (long)psVar20 + (long)a_01 * uVar5);
      psVar11 = (secp256k1_ge *)(uVar8 << ((byte)lVar7 & 0x3f));
      if (psVar12 != psVar11) goto LAB_0014c974;
      psVar12 = (secp256k1_ge *)((long)psStack_188 * (long)psVar20 + uVar19 * uVar5);
      psVar11 = (secp256k1_ge *)((long)psVar4 << ((byte)lVar7 & 0x3f));
      if (psVar12 != psVar11) goto LAB_0014c979;
      psVar11 = (secp256k1_ge *)((long)uVar10 >> 0x3f);
      uStack_f0 = (ulong)((uint)psVar4 & 1);
      uVar14 = -uStack_f0;
      psVar12 = (secp256k1_ge *)((ulong)psVar11 & uVar14);
      uVar10 = uVar10 ^ (ulong)psVar12;
      psVar21 = psVar20;
      psStack_e8 = psVar11;
      if (uVar10 - 0x251 < 0xfffffffffffffb61) goto LAB_0014c97e;
      uVar10 = uVar10 - 1;
      a = (secp256k1_ge *)
          ((long)(psStack_188->x).n + (((ulong)psVar11 ^ uVar6) - (long)psVar11 & uVar14));
      uVar6 = (uVar6 + ((ulong)a & (ulong)psVar12)) * 2;
      uVar19 = uVar19 + (((ulong)psVar11 ^ (ulong)a_01) - (long)psVar11 & uVar14);
      a_01 = (secp256k1_ge *)(((long)(a_01->x).n + (uVar19 & (ulong)psVar12)) * 2);
      uVar14 = (long)(psVar4->modulus).v + (((ulong)psVar11 ^ uVar8) - (long)psVar11 & uVar14);
      psVar4 = (secp256k1_modinv64_modinfo *)(uVar14 >> 1);
      uVar8 = uVar8 + (uVar14 & (ulong)psVar12);
      lVar7 = lVar7 + 1;
      psStack_188 = a;
    } while (lVar7 != 0x3e);
    psVar11 = (secp256k1_ge *)(uVar6 * uVar19);
    unaff_R15 = psVar20;
    uStack_158 = uVar5;
    uStack_f8 = uVar3;
    auStack_e0._48_8_ = a_01;
    uStack_a8 = uVar6;
    uStack_a0 = uVar19;
    psStack_98 = a;
    if ((SUB168(SEXT816((long)a_01) * SEXT816((long)a),8) -
        SUB168(SEXT816((long)uVar6) * SEXT816((long)uVar19),8)) -
        (ulong)((secp256k1_ge *)((long)a_01 * (long)a) < psVar11) != 2 ||
        (long)a_01 * (long)a - (long)psVar11 != 0) goto LAB_0014c9fb;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c189;
    secp256k1_modinv64_update_de_62
              (&sStack_90,&sStack_60,(secp256k1_modinv64_trans2x2 *)(auStack_e0 + 0x30),psStack_180)
    ;
    a_00 = (secp256k1_ge *)auStack_130;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c1a7;
    psVar12 = a_00;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_180->modulus,-1);
    if (iVar1 < 1) {
LAB_0014c983:
      a_00 = psVar12;
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c988;
      secp256k1_modinv64_cold_27();
LAB_0014c988:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c98d;
      secp256k1_modinv64_cold_26();
LAB_0014c98d:
      a = a_00;
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c992;
      secp256k1_modinv64_cold_25();
LAB_0014c992:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c997;
      secp256k1_modinv64_cold_24();
LAB_0014c997:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c99c;
      secp256k1_modinv64_cold_4();
LAB_0014c99c:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9a1;
      secp256k1_modinv64_cold_5();
      psVar20 = psVar21;
LAB_0014c9a1:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9a6;
      secp256k1_modinv64_cold_21();
LAB_0014c9a6:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9ab;
      secp256k1_modinv64_cold_20();
LAB_0014c9ab:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9b0;
      secp256k1_modinv64_cold_19();
LAB_0014c9b0:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9b5;
      secp256k1_modinv64_cold_18();
LAB_0014c9b5:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9ba;
      secp256k1_modinv64_cold_17();
LAB_0014c9ba:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9bf;
      secp256k1_modinv64_cold_16();
LAB_0014c9bf:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9c4;
      secp256k1_modinv64_cold_15();
      unaff_R15 = psVar20;
LAB_0014c9c4:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9c9;
      secp256k1_modinv64_cold_14();
LAB_0014c9c9:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9ce;
      secp256k1_modinv64_cold_13();
LAB_0014c9ce:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9d3;
      secp256k1_modinv64_cold_12();
LAB_0014c9d3:
      psVar12 = a;
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9d8;
      secp256k1_modinv64_cold_11();
LAB_0014c9d8:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9dd;
      secp256k1_modinv64_cold_10();
LAB_0014c9dd:
      a = psVar12;
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9e2;
      secp256k1_modinv64_cold_9();
LAB_0014c9e2:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9e7;
      secp256k1_modinv64_cold_8();
      psVar20 = unaff_R15;
LAB_0014c9e7:
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9ec;
      secp256k1_modinv64_cold_23();
LAB_0014c9ec:
      unaff_R15 = psVar20;
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9f1;
      secp256k1_modinv64_cold_22();
      goto LAB_0014c9f1;
    }
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c1c6;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_00,5,&psStack_180->modulus,1);
    if (0 < iVar1) goto LAB_0014c988;
    a = (secp256k1_ge *)auStack_e0;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c1ef;
    a_00 = a;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a,5,&psStack_180->modulus,-1);
    if (iVar1 < 1) goto LAB_0014c98d;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c20e;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a,5,&psStack_180->modulus,1);
    unaff_R15 = psStack_180;
    if (-1 < iVar1) goto LAB_0014c992;
    psVar11 = (secp256k1_ge *)((long)a_01 * uStack_158);
    lVar7 = SUB168(SEXT816((long)a_01) * SEXT816((long)uStack_158),8);
    uVar2 = uVar6 * (long)psVar20;
    a = SUB168(SEXT816((long)uVar6) * SEXT816((long)psVar20),8);
    if ((-1 < (long)a) &&
       (uVar5 = (ulong)((secp256k1_ge *)(-1 - uVar2) < psVar11),
       lVar9 = (0x7fffffffffffffff - (long)a) - lVar7,
       (SBORROW8(0x7fffffffffffffff - (long)a,lVar7) != SBORROW8(lVar9,uVar5)) !=
       (long)(lVar9 - uVar5) < 0)) goto LAB_0014c9e7;
    puVar13 = (uint64_t *)((long)(psVar11->x).n + uVar2);
    a = (secp256k1_ge *)((long)(a->x).n + (ulong)CARRY8(uVar2,(ulong)psVar11) + lVar7);
    uVar2 = uVar19 * uStack_158;
    lVar7 = SUB168(SEXT816((long)uVar19) * SEXT816((long)uStack_158),8);
    psVar11 = (secp256k1_ge *)((long)psStack_188 * (long)psVar20);
    lVar9 = SUB168(SEXT816((long)psStack_188) * SEXT816((long)psVar20),8);
    if ((-1 < lVar9) &&
       (uVar5 = (ulong)(-(long)psVar11 - 1U < uVar2), lVar17 = (0x7fffffffffffffff - lVar9) - lVar7,
       (SBORROW8(0x7fffffffffffffff - lVar9,lVar7) != SBORROW8(lVar17,uVar5)) !=
       (long)(lVar17 - uVar5) < 0)) goto LAB_0014c9ec;
    bVar22 = CARRY8((ulong)psVar11,uVar2);
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + uVar2);
    lVar7 = lVar9 + lVar7 + (ulong)bVar22;
    if (((ulong)puVar13 & 0x3ffffffffffffffe) != 0) goto LAB_0014c997;
    if (((ulong)psVar11 & 0x3fffffffffffffff) != 0) goto LAB_0014c99c;
    uVar2 = (ulong)puVar13 >> 0x3e | (long)a * 4;
    uVar5 = uStack_148 * (long)a_01 + uVar2;
    lVar9 = SUB168(SEXT816((long)uStack_148) * SEXT816((long)a_01),8) + ((long)a >> 0x3e) +
            (ulong)CARRY8(uStack_148 * (long)a_01,uVar2);
    uVar2 = (long)psStack_140 * uVar6;
    a = SUB168(SEXT816((long)psStack_140) * SEXT816((long)uVar6),8);
    if (-1 < (long)a) {
      uVar3 = (ulong)(-uVar2 - 1 < uVar5);
      lVar17 = (0x7fffffffffffffff - (long)a) - lVar9;
      if ((SBORROW8(0x7fffffffffffffff - (long)a,lVar9) != SBORROW8(lVar17,uVar3)) ==
          (long)(lVar17 - uVar3) < 0) goto LAB_0014c346;
      goto LAB_0014c9a1;
    }
    lVar16 = (-0x8000000000000000 - (long)a) - (ulong)(uVar2 != 0);
    lVar17 = lVar9 - lVar16;
    if ((SBORROW8(lVar9,lVar16) != SBORROW8(lVar17,(ulong)(uVar5 < -uVar2))) !=
        (long)(lVar17 - (ulong)(uVar5 < -uVar2)) < 0) goto LAB_0014c9a1;
LAB_0014c346:
    uVar3 = (ulong)psVar11 >> 0x3e | lVar7 * 4;
    a = (secp256k1_ge *)((long)(a->x).n + (ulong)CARRY8(uVar2,uVar5) + lVar9);
    uVar8 = uStack_148 * uVar19 + uVar3;
    lVar7 = SUB168(SEXT816((long)uStack_148) * SEXT816((long)uVar19),8) + (lVar7 >> 0x3e) +
            (ulong)CARRY8(uStack_148 * uVar19,uVar3);
    uVar3 = (long)psStack_140 * (long)psStack_188;
    psVar11 = SUB168(SEXT816((long)psStack_140) * SEXT816((long)psStack_188),8);
    if (-1 < (long)psVar11) {
      uVar14 = (ulong)(-uVar3 - 1 < uVar8);
      lVar9 = (0x7fffffffffffffff - (long)psVar11) - lVar7;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar11,lVar7) != SBORROW8(lVar9,uVar14)) ==
          (long)(lVar9 - uVar14) < 0) goto LAB_0014c3c6;
      goto LAB_0014c9a6;
    }
    lVar17 = (-0x8000000000000000 - (long)psVar11) - (ulong)(uVar3 != 0);
    lVar9 = lVar7 - lVar17;
    if ((SBORROW8(lVar7,lVar17) != SBORROW8(lVar9,(ulong)(uVar8 < -uVar3))) !=
        (long)(lVar9 - (ulong)(uVar8 < -uVar3)) < 0) goto LAB_0014c9a6;
LAB_0014c3c6:
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + (ulong)CARRY8(uVar3,uVar8) + lVar7);
    uVar14 = (long)a * 4 | uVar2 + uVar5 >> 0x3e;
    uStack_158 = uVar2 + uVar5 & 0x3fffffffffffffff;
    psStack_100 = (secp256k1_modinv64_modinfo *)(uVar3 + uVar8 & 0x3fffffffffffffff);
    psVar12 = (secp256k1_ge *)(uStack_160 * (long)a_01 + uVar14);
    lVar7 = SUB168(SEXT816((long)uStack_160) * SEXT816((long)a_01),8) + ((long)a >> 0x3e) +
            (ulong)CARRY8(uStack_160 * (long)a_01,uVar14);
    uVar2 = (long)psStack_150 * uVar6;
    lVar9 = SUB168(SEXT816((long)psStack_150) * SEXT816((long)uVar6),8);
    psVar20 = psStack_150;
    auStack_130._0_8_ = uStack_158;
    auStack_e0._0_8_ = psStack_100;
    if (-1 < lVar9) {
      a = (secp256k1_ge *)(-1 - uVar2);
      lVar17 = (0x7fffffffffffffff - lVar9) - lVar7;
      if ((SBORROW8(0x7fffffffffffffff - lVar9,lVar7) != SBORROW8(lVar17,(ulong)(a < psVar12))) ==
          (long)(lVar17 - (ulong)(a < psVar12)) < 0) goto LAB_0014c47c;
      goto LAB_0014c9ab;
    }
    lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar2 != 0);
    lVar17 = lVar7 - lVar16;
    a = (secp256k1_ge *)(lVar17 - (ulong)(psVar12 < (secp256k1_ge *)-uVar2));
    if ((SBORROW8(lVar7,lVar16) != SBORROW8(lVar17,(ulong)(psVar12 < (secp256k1_ge *)-uVar2))) !=
        (long)a < 0) goto LAB_0014c9ab;
LAB_0014c47c:
    uVar5 = uVar3 + uVar8 >> 0x3e | (long)psVar11 * 4;
    puVar13 = (uint64_t *)((long)(psVar12->x).n + uVar2);
    lVar7 = lVar7 + lVar9 + (ulong)CARRY8((ulong)psVar12,uVar2);
    psVar12 = (secp256k1_ge *)(uStack_160 * uVar19 + uVar5);
    a = (secp256k1_ge *)
        (SUB168(SEXT816((long)uStack_160) * SEXT816((long)uVar19),8) + ((long)psVar11 >> 0x3e) +
        (ulong)CARRY8(uStack_160 * uVar19,uVar5));
    uVar2 = (long)psStack_150 * (long)psStack_188;
    lVar9 = SUB168(SEXT816((long)psStack_150) * SEXT816((long)psStack_188),8);
    if (-1 < lVar9) {
      psVar11 = (secp256k1_ge *)(-1 - uVar2);
      lVar17 = (0x7fffffffffffffff - lVar9) - (long)a;
      if ((SBORROW8(0x7fffffffffffffff - lVar9,(long)a) !=
          SBORROW8(lVar17,(ulong)(psVar11 < psVar12))) ==
          (long)(lVar17 - (ulong)(psVar11 < psVar12)) < 0) goto LAB_0014c4eb;
      goto LAB_0014c9b0;
    }
    lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar2 != 0);
    lVar17 = (long)a - lVar16;
    psVar11 = (secp256k1_ge *)(lVar17 - (ulong)(psVar12 < (secp256k1_ge *)-uVar2));
    if ((SBORROW8((long)a,lVar16) != SBORROW8(lVar17,(ulong)(psVar12 < (secp256k1_ge *)-uVar2))) !=
        (long)psVar11 < 0) goto LAB_0014c9b0;
LAB_0014c4eb:
    puVar15 = (uint64_t *)((long)(psVar12->x).n + uVar2);
    a = (secp256k1_ge *)((long)(a->x).n + (ulong)CARRY8((ulong)psVar12,uVar2) + lVar9);
    uVar2 = lVar7 * 4 | (ulong)puVar13 >> 0x3e;
    auStack_130._8_8_ = (ulong)puVar13 & 0x3fffffffffffffff;
    psVar20 = (secp256k1_modinv64_modinfo *)((ulong)puVar15 & 0x3fffffffffffffff);
    uVar5 = uStack_138 * (long)a_01 + uVar2;
    psVar11 = (secp256k1_ge *)
              (SUB168(SEXT816((long)uStack_138) * SEXT816((long)a_01),8) + (lVar7 >> 0x3e) +
              (ulong)CARRY8(uStack_138 * (long)a_01,uVar2));
    uVar2 = uStack_168 * uVar6;
    lVar7 = SUB168(SEXT816((long)uStack_168) * SEXT816((long)uVar6),8);
    auStack_e0._8_8_ = psVar20;
    if (-1 < lVar7) {
      uVar3 = (ulong)(-uVar2 - 1 < uVar5);
      lVar9 = (0x7fffffffffffffff - lVar7) - (long)psVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar7,(long)psVar11) != SBORROW8(lVar9,uVar3)) ==
          (long)(lVar9 - uVar3) < 0) goto LAB_0014c57d;
      goto LAB_0014c9b5;
    }
    lVar17 = (-0x8000000000000000 - lVar7) - (ulong)(uVar2 != 0);
    lVar9 = (long)psVar11 - lVar17;
    if ((SBORROW8((long)psVar11,lVar17) != SBORROW8(lVar9,(ulong)(uVar5 < -uVar2))) !=
        (long)(lVar9 - (ulong)(uVar5 < -uVar2)) < 0) goto LAB_0014c9b5;
LAB_0014c57d:
    uVar3 = (ulong)puVar15 >> 0x3e | (long)a * 4;
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + (ulong)CARRY8(uVar5,uVar2) + lVar7);
    psVar12 = (secp256k1_ge *)(uStack_138 * uVar19 + uVar3);
    lVar7 = SUB168(SEXT816((long)uStack_138) * SEXT816((long)uVar19),8) + ((long)a >> 0x3e) +
            (ulong)CARRY8(uStack_138 * uVar19,uVar3);
    uVar3 = uStack_168 * (long)psStack_188;
    lVar9 = SUB168(SEXT816((long)uStack_168) * SEXT816((long)psStack_188),8);
    if (-1 < lVar9) {
      a = (secp256k1_ge *)(-1 - uVar3);
      lVar17 = (0x7fffffffffffffff - lVar9) - lVar7;
      if ((SBORROW8(0x7fffffffffffffff - lVar9,lVar7) != SBORROW8(lVar17,(ulong)(a < psVar12))) ==
          (long)(lVar17 - (ulong)(a < psVar12)) < 0) goto LAB_0014c5f5;
      goto LAB_0014c9ba;
    }
    lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar3 != 0);
    lVar17 = lVar7 - lVar16;
    a = (secp256k1_ge *)(lVar17 - (ulong)(psVar12 < (secp256k1_ge *)-uVar3));
    if ((SBORROW8(lVar7,lVar16) != SBORROW8(lVar17,(ulong)(psVar12 < (secp256k1_ge *)-uVar3))) !=
        (long)a < 0) goto LAB_0014c9ba;
LAB_0014c5f5:
    puVar13 = (uint64_t *)((long)(psVar12->x).n + uVar3);
    lVar7 = lVar7 + lVar9 + (ulong)CARRY8((ulong)psVar12,uVar3);
    uVar3 = (long)psVar11 * 4 | uVar5 + uVar2 >> 0x3e;
    auStack_130._16_8_ = uVar5 + uVar2 & 0x3fffffffffffffff;
    psStack_150 = (secp256k1_modinv64_modinfo *)((ulong)puVar13 & 0x3fffffffffffffff);
    auVar23 = SEXT816((long)a_01);
    uVar2 = uStack_178 * (long)a_01;
    a_01 = (secp256k1_ge *)(uVar2 + uVar3);
    a = (secp256k1_ge *)
        (SUB168(SEXT816((long)uStack_178) * auVar23,8) + ((long)psVar11 >> 0x3e) +
        (ulong)CARRY8(uVar2,uVar3));
    uVar2 = (long)psStack_170 * uVar6;
    lVar9 = SUB168(SEXT816((long)psStack_170) * SEXT816((long)uVar6),8);
    if (lVar9 < 0) {
      lVar16 = (-0x8000000000000000 - lVar9) - (ulong)(uVar2 != 0);
      lVar17 = (long)a - lVar16;
      bVar22 = SBORROW8((long)a,lVar16) != SBORROW8(lVar17,(ulong)(a_01 < (secp256k1_ge *)-uVar2));
      psVar11 = (secp256k1_ge *)(lVar17 - (ulong)(a_01 < (secp256k1_ge *)-uVar2));
      psVar12 = psVar11;
    }
    else {
      psVar11 = (secp256k1_ge *)(-1 - uVar2);
      lVar17 = (0x7fffffffffffffff - lVar9) - (long)a;
      bVar22 = SBORROW8(0x7fffffffffffffff - lVar9,(long)a) !=
               SBORROW8(lVar17,(ulong)(psVar11 < a_01));
      psVar12 = (secp256k1_ge *)(lVar17 - (ulong)(psVar11 < a_01));
    }
    auStack_e0._16_8_ = psStack_150;
    if (bVar22 != (long)psVar12 < 0) goto LAB_0014c9bf;
    uVar5 = (ulong)puVar13 >> 0x3e | lVar7 * 4;
    puVar13 = (uint64_t *)((long)(a_01->x).n + uVar2);
    a = (secp256k1_ge *)((long)(a->x).n + (ulong)CARRY8((ulong)a_01,uVar2) + lVar9);
    a_01 = (secp256k1_ge *)(uStack_178 * uVar19 + uVar5);
    psVar11 = (secp256k1_ge *)
              (SUB168(SEXT816((long)uStack_178) * SEXT816((long)uVar19),8) + (lVar7 >> 0x3e) +
              (ulong)CARRY8(uStack_178 * uVar19,uVar5));
    uVar2 = (long)psStack_170 * (long)psStack_188;
    lVar7 = SUB168(SEXT816((long)psStack_170) * SEXT816((long)psStack_188),8);
    psStack_140 = psVar20;
    if (-1 < lVar7) {
      uVar5 = (ulong)((secp256k1_ge *)(-1 - uVar2) < a_01);
      lVar9 = (0x7fffffffffffffff - lVar7) - (long)psVar11;
      if ((SBORROW8(0x7fffffffffffffff - lVar7,(long)psVar11) != SBORROW8(lVar9,uVar5)) ==
          (long)(lVar9 - uVar5) < 0) goto LAB_0014c73d;
      goto LAB_0014c9c4;
    }
    lVar17 = (-0x8000000000000000 - lVar7) - (ulong)(uVar2 != 0);
    lVar9 = (long)psVar11 - lVar17;
    if ((SBORROW8((long)psVar11,lVar17) != SBORROW8(lVar9,(ulong)(a_01 < (secp256k1_ge *)-uVar2)))
        != (long)(lVar9 - (ulong)(a_01 < (secp256k1_ge *)-uVar2)) < 0) goto LAB_0014c9c4;
LAB_0014c73d:
    psVar12 = (secp256k1_ge *)auStack_130;
    bVar22 = CARRY8((ulong)a_01,uVar2);
    a_01 = (secp256k1_ge *)((long)(a_01->x).n + uVar2);
    psVar11 = (secp256k1_ge *)((long)(psVar11->x).n + (ulong)bVar22 + lVar7);
    uVar5 = (long)a * 4 | (ulong)puVar13 >> 0x3e;
    uVar2 = (ulong)puVar13 & 0x3fffffffffffffff;
    uStack_168 = (ulong)a_01 & 0x3fffffffffffffff;
    a = (secp256k1_ge *)(((long)a >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar5));
    uStack_160 = auStack_130._16_8_;
    uStack_148 = auStack_130._8_8_;
    auStack_130._24_8_ = uVar2;
    auStack_e0._24_8_ = uStack_168;
    if (a != (secp256k1_ge *)0xffffffffffffffff) goto LAB_0014c9c9;
    a_01 = (secp256k1_ge *)((ulong)a_01 >> 0x3e | (long)psVar11 * 4);
    psVar11 = (secp256k1_ge *)
              (((long)psVar11 >> 0x3e) + -1 + (ulong)((secp256k1_ge *)0x7fffffffffffffff < a_01));
    auStack_130._32_8_ = uVar5;
    if (psVar11 != (secp256k1_ge *)0xffffffffffffffff) goto LAB_0014c9ce;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c7d2;
    a = psVar12;
    uStack_178 = uVar5;
    auStack_e0._32_8_ = a_01;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar12,5,&psStack_180->modulus,-1);
    if (iVar1 < 1) goto LAB_0014c9d3;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c7ef;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar12,5,&unaff_R15->modulus,1);
    if (0 < iVar1) goto LAB_0014c9d8;
    a = (secp256k1_ge *)auStack_e0;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c816;
    psVar12 = a;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&unaff_R15->modulus,-1)
    ;
    if (iVar1 < 1) goto LAB_0014c9dd;
    psVar11 = (secp256k1_ge *)0x5;
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c833;
    iVar1 = secp256k1_modinv64_mul_cmp_62((secp256k1_modinv64_signed62 *)a,5,&unaff_R15->modulus,1);
    if (-1 < iVar1) goto LAB_0014c9e2;
    uVar18 = (int)uStack_f8 + 1;
    uVar3 = (ulong)uVar18;
    psVar20 = psStack_100;
    uVar5 = uStack_158;
    psStack_170 = a_01;
  } while (uVar18 != 10);
  a = (secp256k1_ge *)auStack_e0;
  psVar11 = (secp256k1_ge *)0x5;
  psStack_198 = (secp256k1_modinv64_modinfo *)0x14c87d;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar1 != 0) {
LAB_0014c9f1:
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9f6;
    secp256k1_modinv64_cold_6();
LAB_0014c9f6:
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c9fb;
    secp256k1_modinv64_cold_7();
LAB_0014c9fb:
    psStack_198 = (secp256k1_modinv64_modinfo *)secp256k1_eckey_pubkey_tweak_add;
    secp256k1_modinv64_cold_3();
    uStack_1a8 = uVar10;
    psStack_1a0 = a_01;
    psStack_198 = unaff_R15;
    secp256k1_gej_set_ge(&sStack_b10,a);
    sStack_b28.aux = asStack_a78;
    sStack_b28.pre_a = asStack_8f8;
    sStack_b28.ps = &sStack_5b8;
    secp256k1_ecmult_strauss_wnaf
              (&sStack_b28,&sStack_b10,1,&sStack_b10,&secp256k1_scalar_one,
               (secp256k1_scalar *)psVar11);
    secp256k1_gej_verify(&sStack_b10);
    if (sStack_b10.infinity == 0) {
      secp256k1_ge_set_gej(a,&sStack_b10);
    }
    return;
  }
  psStack_198 = (secp256k1_modinv64_modinfo *)0x14c8a2;
  iVar1 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)auStack_130,5,&SECP256K1_SIGNED62_ONE,-1);
  a_01 = (secp256k1_ge *)auStack_130._40_8_;
  if (iVar1 != 0) {
    psStack_198 = (secp256k1_modinv64_modinfo *)0x14c8c9;
    iVar1 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_130,5,&SECP256K1_SIGNED62_ONE,1);
    if (iVar1 != 0) {
      psVar11 = (secp256k1_ge *)0x5;
      psStack_198 = (secp256k1_modinv64_modinfo *)0x14c8e3;
      a = a_01;
      iVar1 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar1 == 0) {
        a = (secp256k1_ge *)&sStack_90;
        psVar11 = (secp256k1_ge *)0x5;
        psStack_198 = (secp256k1_modinv64_modinfo *)0x14c906;
        iVar1 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)a,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar1 == 0) {
          a = (secp256k1_ge *)auStack_130;
          psVar11 = (secp256k1_ge *)0x5;
          psStack_198 = (secp256k1_modinv64_modinfo *)0x14c925;
          iVar1 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a,5,&unaff_R15->modulus,1);
          if (iVar1 == 0) goto LAB_0014c92d;
        }
      }
      goto LAB_0014c9f6;
    }
  }
LAB_0014c92d:
  psStack_198 = (secp256k1_modinv64_modinfo *)0x14c945;
  secp256k1_modinv64_normalize_62(&sStack_90,uStack_178,unaff_R15);
  (a_01->x).n[4] = sStack_90.v[4];
  (a_01->x).n[2] = sStack_90.v[2];
  (a_01->x).n[3] = sStack_90.v[3];
  (a_01->x).n[0] = sStack_90.v[0];
  (a_01->x).n[1] = sStack_90.v[1];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_half(secp256k1_fe *r) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY_MAGNITUDE(r, 31);

    secp256k1_fe_impl_half(r);
    r->magnitude = (r->magnitude >> 1) + 1;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}